

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O1

bool __thiscall cppjieba::MPSegment::IsUserDictSingleChineseWord(MPSegment *this,Rune *value)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  
  bVar2 = false;
  p_Var1 = std::
           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::_M_find_before_node
                     (&(this->dictTrie_->user_dict_single_chinese_word_)._M_h,
                      (ulong)*value %
                      (this->dictTrie_->user_dict_single_chinese_word_)._M_h._M_bucket_count,value,
                      (ulong)*value);
  if (p_Var1 != (__node_base_ptr)0x0) {
    bVar2 = p_Var1->_M_nxt != (_Hash_node_base *)0x0;
  }
  return bVar2;
}

Assistant:

bool IsUserDictSingleChineseWord(const Rune& value) const {
    return dictTrie_->IsUserDictSingleChineseWord(value);
  }